

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::DumpMarkTemp(BackwardPass *this)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  Phase PVar4;
  undefined4 *puVar5;
  
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x194c,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pBVar1 = this->currentBlock;
  PVar4 = this->tag;
  if (PVar4 == BackwardPhase) {
    bVar3 = SatisfyMarkTempObjectsConditions(this);
    if (bVar3) {
      TempTrackerBase::Dump((TempTrackerBase *)pBVar1->tempObjectTracker,L"MarkTempObject");
    }
    PVar4 = this->tag;
  }
  if (PVar4 == DeadStorePhase) {
    bVar3 = SatisfyMarkTempObjectsConditions(this);
    if (bVar3) {
      TempTrackerBase::Dump
                ((TempTrackerBase *)pBVar1->tempObjectVerifyTracker,L"MarkTempObjectVerify");
      return;
    }
  }
  return;
}

Assistant:

void
BackwardPass::DumpMarkTemp()
{
    Assert(!IsCollectionPass());

    BasicBlock * block = this->currentBlock;
    if (this->DoMarkTempNumbers())
    {
        block->tempNumberTracker->Dump();
    }
    if (this->DoMarkTempObjects())
    {
        block->tempObjectTracker->Dump();
    }
#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        block->tempObjectVerifyTracker->Dump();
    }
#endif
}